

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O0

void buf_insert(char *buf,wchar_t pos,char key)

{
  size_t sVar1;
  wchar_t local_1c;
  wchar_t len;
  char key_local;
  wchar_t pos_local;
  char *buf_local;
  
  sVar1 = strlen(buf);
  for (local_1c = (wchar_t)sVar1; pos <= local_1c; local_1c = local_1c + L'\xffffffff') {
    buf[local_1c + L'\x01'] = buf[local_1c];
  }
  buf[pos] = key;
  return;
}

Assistant:

static void buf_insert(char *buf, int pos, char key)
{
    int len = strlen(buf); /* len must be signed, it may go to -1 */
    
    while (len >= pos) {
	buf[len+1] = buf[len];
	len--;
    }
    buf[pos] = key;
}